

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O1

void hexdumpbytes<unsigned_char_const*>(string *str,uchar *buf,size_t nLength,char sep)

{
  size_t sVar1;
  char *pcVar2;
  
  std::__cxx11::string::resize((ulong)str,(char)str->_M_string_length + (char)nLength * '\x03');
  if (nLength != 0) {
    pcVar2 = (str->_M_dataplus)._M_p + str->_M_string_length + nLength * -3;
    sVar1 = 0;
    do {
      *pcVar2 = sep;
      byte2hexchars(buf[sVar1],pcVar2 + 1);
      sVar1 = sVar1 + 1;
      pcVar2 = pcVar2 + 3;
    } while (nLength != sVar1);
  }
  return;
}

Assistant:

void hexdumpbytes(std::string &str, I buf, size_t nLength, char sep=' ')
{
    str.resize(str.size()+nLength*3);
    char *p= &str[str.size()-nLength*3];
    while(nLength--)
    {
        *p++ = sep;
        byte2hexchars(get8(buf), p); p+=2; buf++;
    }
}